

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestHelpers.hpp
# Opt level: O2

bool testAccEval<double,GridMethodBatch>
               (vector<double,_std::allocator<double>_> *x,
               vector<double,_std::allocator<double>_> *y,int numx,double tolerance,
               TasmanianSparseGrid *grid,string *message)

{
  double err;
  bool bVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> temp_x;
  vector<double,_std::allocator<double>_> test_y;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_58;
  string local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::evaluateBatch<double>((vector *)grid,(vector *)x);
  if (*(long *)(grid + 8) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (long)*(int *)(*(long *)(grid + 8) + 0x14);
  }
  err = err1<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
                  (lVar2 * numx,(vector<double,_std::allocator<double>_> *)&local_58,y);
  std::__cxx11::string::string((string *)&local_40,(string *)message);
  bVar1 = testPass(err,tolerance,&local_40,grid);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
  return bVar1;
}

Assistant:

bool testAccEval(std::vector<double> const &x, std::vector<double> const &y, int numx, double tolerance, TasmanianSparseGrid &grid, std::string message){
    std::vector<T> test_y, temp_x;
    std::vector<T> const &test_x = getVector(x, temp_x, Utils::size_mult(grid.getNumDimensions(), numx));

    if (std::is_same<EvalMethod, GridMethodBatch>::value){
        grid.evaluateBatch(test_x, test_y);
    }else if (std::is_same<EvalMethod, GridMethodFast>::value){
        test_y = std::vector<T>(Utils::size_mult(numx, grid.getNumOutputs()));
        Utils::Wrapper2D<T const> wx(grid.getNumDimensions(), test_x.data());
        Utils::Wrapper2D<T> wy(grid.getNumOutputs(), test_y.data());
        for(int i=0; i<numx; i++)
            grid.evaluateFast(wx.getStrip(i), wy.getStrip(i));
    }
    return testPass(err1(Utils::size_mult(numx, grid.getNumOutputs()), test_y, y), tolerance, message, grid);
}